

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kyber.cc
# Opt level: O2

void scalar_encode(uint8_t *out,scalar *s,int bits)

{
  int iVar1;
  byte bVar2;
  int iVar3;
  int i;
  long lVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  
  bVar2 = 0;
  iVar1 = 0;
  for (lVar4 = 0; lVar4 != 0x100; lVar4 = lVar4 + 1) {
    uVar6 = (uint)s->c[lVar4];
    for (iVar7 = 0; iVar5 = bits - iVar7, iVar5 != 0 && iVar7 <= bits; iVar7 = iVar7 + iVar3) {
      iVar3 = 8 - iVar1;
      if (iVar5 < iVar3) {
        bVar2 = bVar2 | (byte)((*(byte *)((long)kInverseNTTRoots + (long)iVar5 + 0xff) & uVar6) <<
                              ((byte)iVar1 & 0x1f));
        iVar1 = iVar1 + iVar5;
        iVar3 = iVar5;
      }
      else {
        *out = bVar2 | (byte)((mlkem::(anonymous_namespace)::kMasks[7 - iVar1] & uVar6) <<
                             ((byte)iVar1 & 0x1f));
        out = out + 1;
        bVar2 = 0;
        iVar1 = 0;
      }
      uVar6 = (uVar6 & 0xffff) >> ((byte)iVar3 & 0x1f);
    }
  }
  if (0 < iVar1) {
    *out = bVar2;
  }
  return;
}

Assistant:

static void scalar_encode(uint8_t *out, const scalar *s, int bits) {
  assert(bits <= (int)sizeof(*s->c) * 8 && bits != 1);

  uint8_t out_byte = 0;
  int out_byte_bits = 0;

  for (int i = 0; i < DEGREE; i++) {
    uint16_t element = s->c[i];
    int element_bits_done = 0;

    while (element_bits_done < bits) {
      int chunk_bits = bits - element_bits_done;
      int out_bits_remaining = 8 - out_byte_bits;
      if (chunk_bits >= out_bits_remaining) {
        chunk_bits = out_bits_remaining;
        out_byte |= (element & kMasks[chunk_bits - 1]) << out_byte_bits;
        *out = out_byte;
        out++;
        out_byte_bits = 0;
        out_byte = 0;
      } else {
        out_byte |= (element & kMasks[chunk_bits - 1]) << out_byte_bits;
        out_byte_bits += chunk_bits;
      }

      element_bits_done += chunk_bits;
      element >>= chunk_bits;
    }
  }

  if (out_byte_bits > 0) {
    *out = out_byte;
  }
}